

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O1

size_t duckdb_je_prof_bt_count(void)

{
  char cVar1;
  ushort **ppuVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  long *in_FS_OFFSET;
  
  pcVar5 = (char *)0x0;
  duckdb_je_tsd_fetch_slow((tsd_t *)(*in_FS_OFFSET + -0x2a90),false);
  cVar1 = *pcVar5;
  if ((long)cVar1 != 0) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[cVar1] & 0x8001) != 0) {
      uVar3 = 1;
      do {
        uVar4 = (ulong)uVar3;
        if ((long)pcVar5[uVar4] == 0) {
          return 0x16;
        }
        uVar3 = uVar3 + 1;
      } while (((*ppuVar2)[pcVar5[uVar4]] & 0x8001) != 0);
    }
  }
  return 0x16;
}

Assistant:

size_t
prof_bt_count(void) {
	size_t bt_count;
	tsd_t *tsd;
	prof_tdata_t *tdata;

	tsd = tsd_fetch();
	tdata = prof_tdata_get(tsd, false);
	if (tdata == NULL) {
		return 0;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &bt2gctx_mtx);
	bt_count = ckh_count(&bt2gctx);
	malloc_mutex_unlock(tsd_tsdn(tsd), &bt2gctx_mtx);

	return bt_count;
}